

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

int GetNextRealNumber(string *in,double *val,size_type *pos,size_type *pos2)

{
  int iVar1;
  size_type sVar2;
  double dVar3;
  char *local_48 [4];
  
  sVar2 = std::__cxx11::string::find((char)in,0x2c);
  *pos2 = sVar2;
  if (sVar2 == 0xffffffffffffffff) {
    if (in->_M_string_length == *pos) {
      *val = -1.0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)in);
      dVar3 = atof(local_48[0]);
      *val = dVar3;
      std::__cxx11::string::~string((string *)local_48);
    }
    iVar1 = 0;
  }
  else {
    if (sVar2 == *pos) {
      *val = -1.0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)in);
      dVar3 = atof(local_48[0]);
      *val = dVar3;
      std::__cxx11::string::~string((string *)local_48);
      sVar2 = *pos2;
    }
    *pos = sVar2 + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetNextRealNumber(std::string const& in, double& val,
                             std::string::size_type& pos,
                             std::string::size_type& pos2)
{
  pos2 = in.find(',', pos);
  if (pos2 != std::string::npos) {
    if (pos2 - pos == 0) {
      val = -1;
    } else {
      val = atof(in.substr(pos, pos2 - pos).c_str());
    }
    pos = pos2 + 1;
    return 1;
  }
  if (in.size() - pos == 0) {
    val = -1;
  } else {
    val = atof(in.substr(pos, in.size() - pos).c_str());
  }
  return 0;
}